

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void pnga_zero_diagonal(Integer g_a)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  _iterator_hdl hdl;
  int local_sync_end;
  int local_sync_begin;
  Integer adims [2];
  Integer andim;
  Integer atype;
  Integer num_blocks_a;
  char *ptr;
  Integer offset;
  Integer i;
  Integer me;
  Integer hiA [2];
  Integer loA [2];
  Integer hi [2];
  Integer lo [2];
  Integer ld;
  Integer type;
  Integer *in_stack_fffffffffffffc68;
  char **in_stack_fffffffffffffc70;
  Integer *in_stack_fffffffffffffc78;
  Integer *in_stack_fffffffffffffc80;
  _iterator_hdl *in_stack_fffffffffffffc88;
  Integer in_stack_fffffffffffffc90;
  Integer in_stack_fffffffffffffca0;
  _iterator_hdl *in_stack_fffffffffffffcf8;
  Integer in_stack_fffffffffffffd00;
  Integer *in_stack_fffffffffffffe38;
  Integer *in_stack_fffffffffffffe40;
  Integer *in_stack_fffffffffffffe48;
  Integer in_stack_fffffffffffffe50;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  
  pnga_nodeid();
  iVar3 = _ga_sync_end;
  iVar4 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar4 != 0) {
    pnga_sync();
  }
  pnga_inquire(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
               in_stack_fffffffffffffe38);
  pnga_local_iterator_init(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  while (iVar4 = pnga_local_iterator_next
                           (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                            in_stack_fffffffffffffc68), iVar4 != 0) {
    if (0 < local_48) {
      lVar1 = local_40;
      if (local_40 <= local_48) {
        lVar1 = local_48;
      }
      lVar2 = local_50;
      if (local_58 <= local_50) {
        lVar2 = local_58;
      }
      if (lVar1 <= lVar2) {
        sgai_zero_diagonal_block
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
                   in_stack_fffffffffffffc78,(Integer)in_stack_fffffffffffffc70,
                   (Integer)in_stack_fffffffffffffc68,in_stack_fffffffffffffca0);
      }
    }
  }
  if (iVar3 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_zero_diagonal(Integer g_a)
{
  Integer /*dim1, dim2,*/ type;
  Integer ld, lo[2], hi[2], loA[2], hiA[2];
  Integer me = pnga_nodeid (), i, offset;
  char *ptr;
  Integer num_blocks_a;
  Integer atype, andim, adims[2];
  int local_sync_begin,local_sync_end;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();


  pnga_inquire (g_a, &atype, &andim, adims);
  /*dim1 = adims[0];*/
  /*dim2 = adims[1];*/
  type = atype;

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,loA,hiA,&ptr,&ld)) {
    offset = 0;
    if (loA[0] > 0) {
      lo[0] = GA_MAX (loA[0], loA[1]);
      lo[1] = GA_MAX (loA[0], loA[1]);
      hi[0] = GA_MIN (hiA[0], hiA[1]);
      hi[1] = GA_MIN (hiA[0], hiA[1]);
      if (hi[0] >= lo[0]) {
        sgai_zero_diagonal_block(g_a, ptr, lo, hi, ld, offset, type);
      }
    }
  }
#else
  num_blocks_a = pnga_total_blocks(g_a);

  if (num_blocks_a < 0) {
    offset = 0;
    pnga_distribution (g_a, me, loA, hiA);
    /* determine subset of my patch to access */
    if (loA[0] > 0) {
      lo[0] = GA_MAX (loA[0], loA[1]);
      lo[1] = GA_MAX (loA[0], loA[1]);
      hi[0] = GA_MIN (hiA[0], hiA[1]);
      hi[1] = GA_MIN (hiA[0], hiA[1]);
      if (hi[0] >= lo[0]) {
                              /* we got a block containing diagonal elements */
        pnga_access_ptr (g_a, lo, hi, &ptr, &ld);
        sgai_zero_diagonal_block(g_a, ptr, lo, hi, ld, offset, type);
        /* release access to the data */
        pnga_release_update (g_a, lo, hi);
      }
    }
  } else {
    Integer idx, lld[MAXDIM], offset;
    Integer jtot, last, j;
    Integer nproc = pnga_nnodes();
    /* Simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)) {
      for (idx = me; idx < num_blocks_a; idx += nproc) {
        pnga_distribution(g_a, idx, loA, hiA);
        lo[0] = GA_MAX (loA[0], loA[1]);
        lo[1] = GA_MAX (loA[0], loA[1]);
        hi[0] = GA_MIN (hiA[0], hiA[1]);
        hi[1] = GA_MIN (hiA[0], hiA[1]);

        if (hi[0] >= lo[0]) {
          pnga_access_block_ptr(g_a, idx, &ptr, lld);
          /* evaluate offsets for system */
          offset = 0;
          last = andim - 1;
          jtot = 1;
          for (j=0; j<last; j++) {
            offset += (lo[j] - loA[j])*jtot;
            jtot *= lld[j];
          }
          offset += (lo[last]-loA[last])*jtot;
          sgai_zero_diagonal_block(g_a, ptr, lo, hi, lld[0], offset, type);
          pnga_release_update_block(g_a, idx);
        }
      }
    } else {
      /* Uses scalapack block-cyclic data distribution */
      Integer lld[MAXDIM]/*, chk*/;
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);

      while (index[andim-1] < blocks[andim-1]) {
        /* find bounding coordinates of block */
        /*chk = 1;*/
        for (i = 0; i < andim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > adims[i]) hiA[i] = adims[i];
          /*if (hiA[i] < loA[i]) chk = 0;*/
        }
        lo[0] = GA_MAX (loA[0], loA[1]);
        lo[1] = GA_MAX (loA[0], loA[1]);
        hi[0] = GA_MIN (hiA[0], hiA[1]);
        hi[1] = GA_MIN (hiA[0], hiA[1]);

        if (hi[0] >= lo[0]) {
          pnga_access_block_grid_ptr(g_a, index, &ptr, lld);
          /* evaluate offsets for system */
          offset = 0;
          last = andim - 1;
          jtot = 1;
          for (j=0; j<last; j++) {
            offset += (lo[j] - loA[j])*jtot;
            jtot *= lld[j];
          }
          offset += (lo[last]-loA[last])*jtot;
          sgai_zero_diagonal_block(g_a, ptr, lo, hi, lld[0], offset, type);
          pnga_release_update_block_grid(g_a, index);
        }

        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < andim; i++) {
          if (index[i] >= blocks[i] && i<andim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  if(local_sync_end)pnga_sync();
}